

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.h
# Opt level: O0

bool axl::err::completeWithSystemError<bool>(bool result,bool failResult,uint_t errorCode)

{
  undefined1 in_SIL;
  undefined1 in_DIL;
  ErrorRef *unaff_retaddr;
  undefined3 in_stack_fffffffffffffffc;
  uint uVar1;
  
  uVar1 = CONCAT13(in_DIL,in_stack_fffffffffffffffc) & 0x1ffffff;
  uVar1 = CONCAT13((char)(uVar1 >> 0x18),CONCAT12(in_SIL,(short)uVar1)) & 0xff01ffff;
  if ((char)(uVar1 >> 0x18) == (char)(uVar1 >> 0x10)) {
    ErrorRef::ErrorRef(unaff_retaddr,uVar1);
    setError((ErrorRef *)0x15209d);
    ErrorRef::~ErrorRef((ErrorRef *)0x1520a9);
  }
  return (bool)((byte)(uVar1 >> 0x18) & 1);
}

Assistant:

T
completeWithSystemError(
	T result,
	T failResult,
	uint_t errorCode
) {
	if (result == failResult)
		setError(errorCode);

	return result;
}